

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O1

size_t shell_quotearg(char *path,uchar *buf,size_t bufsize)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar uVar3;
  char *pcVar4;
  uchar *puVar5;
  int iVar6;
  char cVar7;
  
  puVar1 = buf + bufsize;
  cVar7 = *path;
  iVar6 = 0;
  puVar5 = buf;
  if (buf < buf + (bufsize - 1) && cVar7 != '\0') {
    pcVar4 = path + 1;
    iVar6 = 0;
    do {
      if (cVar7 == '!') {
        if (iVar6 == 2) {
          puVar2 = puVar5 + 2;
          if (puVar1 <= puVar2) {
            return 0;
          }
          puVar5[0] = '\"';
          puVar5[1] = '\\';
        }
        else if (iVar6 == 1) {
          puVar2 = puVar5 + 2;
          if (puVar1 <= puVar2) {
            return 0;
          }
          puVar5[0] = '\'';
          puVar5[1] = '\\';
        }
        else {
          puVar2 = puVar5 + 1;
          if (puVar1 <= puVar2) {
            return 0;
          }
          *puVar5 = '\\';
        }
        iVar6 = 0;
      }
      else if (cVar7 == '\'') {
        if (iVar6 == 1) {
          if (puVar1 <= puVar5 + 2) {
            return 0;
          }
          puVar5[0] = '\'';
          puVar5[1] = '\"';
          puVar5 = puVar5 + 2;
        }
        else if (iVar6 == 0) {
          if (puVar1 <= puVar5 + 1) {
            return 0;
          }
          *puVar5 = '\"';
          puVar5 = puVar5 + 1;
        }
        iVar6 = 2;
        puVar2 = puVar5;
      }
      else {
        if (iVar6 == 2) {
          if (puVar1 <= puVar5 + 2) {
            return 0;
          }
          puVar5[0] = '\"';
          puVar5[1] = '\'';
          puVar5 = puVar5 + 2;
        }
        else if (iVar6 == 0) {
          if (puVar1 <= puVar5 + 1) {
            return 0;
          }
          *puVar5 = '\'';
          puVar5 = puVar5 + 1;
        }
        iVar6 = 1;
        puVar2 = puVar5;
      }
      puVar5 = puVar2 + 1;
      if (puVar1 <= puVar5) {
        return 0;
      }
      *puVar2 = pcVar4[-1];
      cVar7 = *pcVar4;
    } while ((cVar7 != '\0') && (pcVar4 = pcVar4 + 1, puVar5 < buf + (bufsize - 1)));
  }
  if (iVar6 == 1) {
    uVar3 = '\'';
  }
  else {
    puVar2 = puVar5;
    if (iVar6 != 2) goto LAB_0012162f;
    uVar3 = '\"';
  }
  puVar2 = puVar5 + 1;
  if (puVar1 <= puVar2) {
    return 0;
  }
  *puVar5 = uVar3;
LAB_0012162f:
  if (puVar1 <= puVar2 + 1) {
    return 0;
  }
  *puVar2 = '\0';
  return (long)puVar2 - (long)buf;
}

Assistant:

static size_t
shell_quotearg(const char *path, unsigned char *buf,
               size_t bufsize)
{
    const char *src;
    unsigned char *dst, *endp;

    /*
     * Processing States:
     *  UQSTRING:       unquoted string: ... -- used for quoting exclamation
     *                  marks. This is the initial state
     *  SQSTRING:       single-quoted-string: '... -- any character may follow
     *  QSTRING:        quoted string: "... -- only apostrophes may follow
     */
    enum { UQSTRING, SQSTRING, QSTRING } state = UQSTRING;

    endp = &buf[bufsize];
    src = path;
    dst = buf;
    while(*src && dst < endp - 1) {

        switch(*src) {
            /*
             * Special handling for apostrophe.
             * An apostrophe is always written in quotation marks, e.g.
             * ' -> "'".
             */

        case '\'':
            switch(state) {
            case UQSTRING:      /* Unquoted string */
                if(dst + 1 >= endp)
                    return 0;
                *dst++ = '"';
                break;
            case QSTRING:       /* Continue quoted string */
                break;
            case SQSTRING:      /* Close single quoted string */
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '\'';
                *dst++ = '"';
                break;
            default:
                break;
            }
            state = QSTRING;
            break;

            /*
             * Special handling for exclamation marks. CSH interprets
             * exclamation marks even when quoted with apostrophes. We convert
             * it to the plain string \!, because both Bourne Shell and CSH
             * interpret that as a verbatim exclamation mark.
             */

        case '!':
            switch(state) {
            case UQSTRING:
                if(dst + 1 >= endp)
                    return 0;
                *dst++ = '\\';
                break;
            case QSTRING:
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '"';           /* Closing quotation mark */
                *dst++ = '\\';
                break;
            case SQSTRING:              /* Close single quoted string */
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '\'';
                *dst++ = '\\';
                break;
            default:
                break;
            }
            state = UQSTRING;
            break;

            /*
             * Ordinary character: prefer single-quoted string
             */

        default:
            switch(state) {
            case UQSTRING:
                if(dst + 1 >= endp)
                    return 0;
                *dst++ = '\'';
                break;
            case QSTRING:
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '"';           /* Closing quotation mark */
                *dst++ = '\'';
                break;
            case SQSTRING:      /* Continue single quoted string */
                break;
            default:
                break;
            }
            state = SQSTRING;   /* Start single-quoted string */
            break;
        }

        if(dst + 1 >= endp)
            return 0;
        *dst++ = *src++;
    }

    switch(state) {
    case UQSTRING:
        break;
    case QSTRING:           /* Close quoted string */
        if(dst + 1 >= endp)
            return 0;
        *dst++ = '"';
        break;
    case SQSTRING:          /* Close single quoted string */
        if(dst + 1 >= endp)
            return 0;
        *dst++ = '\'';
        break;
    default:
        break;
    }

    if(dst + 1 >= endp)
        return 0;
    *dst = '\0';

    /* The result cannot be larger than 3 * strlen(path) + 2 */
    /* assert((dst - buf) <= (3 * (src - path) + 2)); */

    return dst - buf;
}